

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

osgen_txtwin_t *
osgen_create_txtwin(int where,void *other,void *parent,uint buf_size,uint buf_lines)

{
  ulong uVar1;
  osgen_txtwin_t *win;
  char *pcVar2;
  char **ppcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar11 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 uVar12;
  
  win = (osgen_txtwin_t *)osgen_create_win(1,where,other,(osgen_win_t *)parent);
  if (win != (osgen_txtwin_t *)0x0) {
    win->txtbufsiz = (ulong)buf_size;
    pcVar2 = (char *)malloc((ulong)buf_size);
    win->txtbuf = pcVar2;
    win->line_ptr_cnt = (ulong)buf_lines;
    ppcVar3 = (char **)malloc((ulong)buf_lines << 3);
    win->line_ptr = ppcVar3;
    if (pcVar2 != (char *)0x0 && ppcVar3 != (char **)0x0) {
      win->txtfree = pcVar2;
      win->line_count = 1;
      win->first_line = 0;
      *ppcVar3 = pcVar2;
      uVar1._0_1_ = (win->base).txtfg;
      uVar1._1_1_ = (win->base).txtbg;
      uVar1._2_2_ = *(undefined2 *)&(win->base).field_0x62;
      uVar1._4_4_ = (win->base).txtattr;
      uVar12 = (undefined1)((uint)uVar1._4_4_ >> 0x18);
      auVar10._8_6_ = 0;
      auVar10._0_8_ = uVar1;
      auVar10[0xe] = uVar12;
      auVar10[0xf] = uVar12;
      uVar12 = (undefined1)((uint)uVar1._4_4_ >> 0x10);
      auVar9._14_2_ = auVar10._14_2_;
      auVar9._8_5_ = 0;
      auVar9._0_8_ = uVar1;
      auVar9[0xd] = uVar12;
      auVar8._13_3_ = auVar9._13_3_;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar1;
      auVar8[0xc] = uVar12;
      uVar12 = (undefined1)((uint)uVar1._4_4_ >> 8);
      auVar7._12_4_ = auVar8._12_4_;
      auVar7._8_3_ = 0;
      auVar7._0_8_ = uVar1;
      auVar7[0xb] = uVar12;
      auVar6._11_5_ = auVar7._11_5_;
      auVar6._8_2_ = 0;
      auVar6._0_8_ = uVar1;
      auVar6[10] = uVar12;
      auVar5._10_6_ = auVar6._10_6_;
      auVar5[8] = 0;
      auVar5._0_8_ = uVar1;
      auVar5[9] = (char)uVar1._4_4_;
      auVar4._9_7_ = auVar5._9_7_;
      auVar4[8] = (char)uVar1._4_4_;
      auVar4._0_8_ = uVar1;
      uVar12 = (undefined1)((ushort)uVar1._2_2_ >> 8);
      auVar11._8_8_ = auVar4._8_8_;
      auVar11[7] = uVar12;
      auVar11[6] = uVar12;
      auVar11[5] = (char)uVar1._2_2_;
      auVar11[4] = (char)uVar1._2_2_;
      auVar11[3] = uVar1._1_1_;
      auVar11[2] = uVar1._1_1_;
      auVar11[1] = (undefined1)uVar1;
      auVar11[0] = (undefined1)uVar1;
      auVar11 = pshuflw(auVar11,auVar11,0x60);
      win->solfg = auVar11._0_4_ >> 0x18;
      win->solbg = auVar11._4_4_ >> 0x18;
      win->solattr = (win->base).txtattr;
      osssb_add_color_code(win);
      return win;
    }
    osgen_delete_win((osgen_win_t *)win);
  }
  return (osgen_txtwin_t *)0x0;
}

Assistant:

static osgen_txtwin_t *osgen_create_txtwin(int where, void *other,
                                           void *parent,
                                           unsigned int buf_size,
                                           unsigned int buf_lines)
{
    osgen_txtwin_t *win;
    
    /* create the base window */
    win = (osgen_txtwin_t *)osgen_create_win(OS_BANNER_TYPE_TEXT,
                                             where, other, parent);

    /* if that failed, give up now */
    if (win == 0)
        return 0;

    /* allocate the window's buffer */
    win->txtbufsiz = buf_size;
    win->txtbuf = (char *)osmalloc(buf_size);

    /* allocate the line starts */
    win->line_ptr_cnt = buf_lines;
    win->line_ptr = (char **)osmalloc(buf_lines * sizeof(char *));

    /* make sure we allocated everything properly */
    if (win->txtbuf == 0 || win->line_ptr == 0)
    {
        /* free anything we allocated */
        osgen_delete_win(&win->base);
        
        /* return failure */
        return 0;
    }

    /* set up the buffer free pointer */
    win->txtfree = win->txtbuf;

    /* start out with a single line in the buffer */
    win->line_count = 1;

    /* set up the first line start */
    win->first_line = 0;
    win->line_ptr[0] = win->txtbuf;

    /* initialize the start-of-line colors */
    win->solfg = win->base.txtfg;
    win->solbg = win->base.txtbg;
    win->solattr = win->base.txtattr;

    /* start the new first line with the current text color */
    osssb_add_color_code(win);

    /* return the new window */
    return win;
}